

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O1

int event_callback_activate_later_nolock_(event_base *base,event_callback *evcb)

{
  unsigned_long uVar1;
  int iVar2;
  unsigned_long uVar3;
  
  iVar2 = 0;
  if ((evcb->evcb_flags & 0x28) == 0) {
    if ((base->th_base_lock != (void *)0x0) && (evthread_lock_debugging_enabled_ != 0)) {
      iVar2 = evthread_is_debug_lock_held_(base->th_base_lock);
      if (iVar2 == 0) {
        event_callback_activate_later_nolock__cold_2();
        goto LAB_0025208e;
      }
    }
    if ((evcb->evcb_flags & 0x28U) == 0) {
      iVar2 = base->event_count + (uint)((evcb->evcb_flags & 0x10U) == 0);
      base->event_count = iVar2;
      if (iVar2 < base->event_count_max) {
        iVar2 = base->event_count_max;
      }
      base->event_count_max = iVar2;
      *(byte *)&evcb->evcb_flags = (byte)evcb->evcb_flags | 0x20;
      iVar2 = base->event_count_active + 1;
      base->event_count_active = iVar2;
      if (iVar2 < base->event_count_active_max) {
        iVar2 = base->event_count_active_max;
      }
      base->event_count_active_max = iVar2;
      if (base->nactivequeues <= (int)(uint)evcb->evcb_pri) {
LAB_0025208e:
        event_callback_activate_later_nolock__cold_1();
      }
      (evcb->evcb_active_next).tqe_next = (event_callback *)0x0;
      (evcb->evcb_active_next).tqe_prev = (base->active_later_queue).tqh_last;
      *(base->active_later_queue).tqh_last = evcb;
      (base->active_later_queue).tqh_last = (event_callback **)evcb;
    }
    iVar2 = 1;
    if ((evthread_id_fn_ != (_func_unsigned_long *)0x0) && (base->running_loop != 0)) {
      uVar1 = base->th_owner_id;
      uVar3 = (*evthread_id_fn_)();
      if (uVar1 != uVar3) {
        evthread_notify_base(base);
      }
    }
  }
  return iVar2;
}

Assistant:

int
event_callback_activate_later_nolock_(struct event_base *base,
    struct event_callback *evcb)
{
	if (evcb->evcb_flags & (EVLIST_ACTIVE|EVLIST_ACTIVE_LATER))
		return 0;

	event_queue_insert_active_later(base, evcb);
	if (EVBASE_NEED_NOTIFY(base))
		evthread_notify_base(base);
	return 1;
}